

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O2

void cmn_live(cmn_t *cmn,mfcc_t **incep,int32 varnorm,int32 nfr)

{
  int iVar1;
  float *pfVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  if (0 < nfr) {
    if (varnorm != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
              ,0x9a,"Variance normalization not implemented in live mode decode\n");
      exit(1);
    }
    for (uVar4 = 0; uVar4 != (uint)nfr; uVar4 = uVar4 + 1) {
      pfVar2 = (float *)incep[uVar4];
      if (0.0 < *pfVar2 || *pfVar2 == 0.0) {
        uVar3 = cmn->veclen;
        if (cmn->veclen < 1) {
          uVar3 = 0;
        }
        for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
          cmn->sum[uVar5] = (mfcc_t)(pfVar2[uVar5] + (float)cmn->sum[uVar5]);
          pfVar2[uVar5] = pfVar2[uVar5] - (float)cmn->cmn_mean[uVar5];
        }
        cmn->nframe = cmn->nframe + 1;
      }
    }
    if (800 < cmn->nframe) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
              ,0x58,"Update from < ");
      for (lVar6 = 0; lVar6 < cmn->veclen; lVar6 = lVar6 + 1) {
        err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar6]);
      }
      uVar5 = 0;
      err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
      iVar1 = cmn->nframe;
      uVar4 = 0;
      if (0 < cmn->veclen) {
        uVar4 = (ulong)(uint)cmn->veclen;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        cmn->cmn_mean[uVar5] = (mfcc_t)((float)cmn->sum[uVar5] / (float)iVar1);
      }
      if (799 < iVar1) {
        for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          cmn->sum[uVar5] = (mfcc_t)((float)cmn->sum[uVar5] * (1.0 / (float)iVar1) * 500.0);
        }
        cmn->nframe = 500;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
              ,0x69,"Update to   < ");
      for (lVar6 = 0; lVar6 < cmn->veclen; lVar6 = lVar6 + 1) {
        err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar6]);
      }
      err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
      return;
    }
  }
  return;
}

Assistant:

void
cmn_live(cmn_t *cmn, mfcc_t **incep, int32 varnorm, int32 nfr)
{
    int32 i, j;

    if (nfr <= 0)
        return;

    if (varnorm)
        E_FATAL
            ("Variance normalization not implemented in live mode decode\n");

    for (i = 0; i < nfr; i++) {

	/* Skip zero energy frames */
	if (incep[i][0] < 0)
	    continue;

        for (j = 0; j < cmn->veclen; j++) {
            cmn->sum[j] += incep[i][j];
            incep[i][j] -= cmn->cmn_mean[j];
        }

        ++cmn->nframe;
    }

    /* Shift buffer down if we have more than CMN_WIN_HWM frames */
    if (cmn->nframe > CMN_WIN_HWM)
        cmn_live_shiftwin(cmn);
}